

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

bool_t prf_model_append_node(prf_model_t *model,prf_node_t *node)

{
  prf_node_t **id;
  uint uVar1;
  prf_nodeinfo_t *ppVar2;
  prf_node_t *anode;
  prf_node_t *ppVar3;
  
  ppVar3 = model->header;
  if (ppVar3 == (prf_node_t *)0x0) {
    if (node->opcode == 1) {
      model->header = node;
      return 1;
    }
  }
  else if (node->opcode != 1) {
    id = ppVar3->children;
    while (id != (prf_node_t **)0x0) {
      uVar1 = prf_array_count(id);
      if (0 < (int)uVar1) {
        ppVar3 = ppVar3->children[(ulong)uVar1 - 1];
      }
      id = ppVar3->children;
    }
    ppVar2 = prf_nodeinfo_get(ppVar3->opcode);
    while( true ) {
      if (ppVar2 == (prf_nodeinfo_t *)0x0) {
        return 1;
      }
      if ((ppVar2->flags & 0x202) == 0) break;
      ppVar3 = ppVar3->parent;
      ppVar2 = prf_nodeinfo_get(ppVar3->opcode);
    }
    return 1;
  }
  prf_error(9,"append node - node doesn\'t fit model");
  return 0;
}

Assistant:

bool_t
prf_model_append_node(
    prf_model_t * model,
    prf_node_t * node )
{
    assert( model != NULL && node != NULL );

    if ( model->header != NULL && node->opcode != 1 ) {
        prf_node_t * anode;
        prf_nodeinfo_t * info;
        int count;

        anode = model->header;
        while ( anode->children != NULL ) {
            if ( (count = prf_array_count( anode->children )) > 0 )
                anode = anode->children[ count - 1 ];
        }
        info = prf_nodeinfo_get( anode->opcode );
        while ( info != NULL &&
                (info->flags & (PRF_POP_NODE | PRF_ANCILLARY)) != 0 ) {
            anode = anode->parent;
            info = prf_nodeinfo_get( anode->opcode );
        }
    } else if ( model->header == NULL && node->opcode == 1 ) {
        model->header = node;
    } else {
        prf_error( 9, "append node - node doesn't fit model" );
        return FALSE;
    }
    return TRUE;
}